

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_d00101::PKDescriptor::MakeScripts
          (PKDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_3,FlatSigningProvider *param_4)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  long in_RSI;
  vector<CScript,_std::allocator<CScript>_> *in_RDI;
  CPubKey *in_R9;
  long in_FS_OFFSET;
  CScript script;
  CScript *in_stack_fffffffffffffed8;
  CPubKey *in_stack_fffffffffffffee0;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffee8;
  CScript *in_stack_fffffffffffffef8;
  CScript *in_stack_ffffffffffffff10;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RSI + 0x58) & 1) == 0) {
    std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffee8,
               (size_type)in_stack_fffffffffffffee0);
    GetScriptForRawPubKey(in_R9);
    Vector<CScript>((CScript *)in_stack_ffffffffffffff18._M_extent_value);
    CScript::~CScript(in_stack_fffffffffffffed8);
  }
  else {
    CScript::CScript(in_stack_fffffffffffffed8);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffee8,
               (size_type)in_stack_fffffffffffffee0);
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    ToByteVector<XOnlyPubKey>((XOnlyPubKey *)in_stack_ffffffffffffff18._M_extent_value);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (in_stack_fffffffffffffee8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee0);
    b._M_extent._M_extent_value = in_stack_ffffffffffffff18._M_extent_value;
    b._M_ptr = (pointer)in_stack_ffffffffffffff10;
    CScript::operator<<(in_stack_fffffffffffffef8,b);
    CScript::operator<<(in_stack_ffffffffffffff10,(opcodetype)((ulong)in_RDI >> 0x20));
    CScript::CScript(in_stack_fffffffffffffed8,(CScript *)0x7009b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee8);
    CScript::~CScript(in_stack_fffffffffffffed8);
    Vector<CScript>((CScript *)in_stack_ffffffffffffff18._M_extent_value);
    CScript::~CScript(in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override
    {
        if (m_xonly) {
            CScript script = CScript() << ToByteVector(XOnlyPubKey(keys[0])) << OP_CHECKSIG;
            return Vector(std::move(script));
        } else {
            return Vector(GetScriptForRawPubKey(keys[0]));
        }
    }